

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

float closest_point_ray_segment(vec3 p1,vec3 q1,vec3 p2,vec3 q2,float *s,float *t,vec3 *c1,vec3 *c2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined4 in_EAX;
  uint uVar4;
  byte bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar16;
  undefined8 uVar15;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  fVar6 = p2.z;
  fVar7 = p1.z;
  fVar8 = p1.x;
  fVar10 = q1.x - fVar8;
  fVar9 = p1.y;
  fVar11 = q1.y - fVar9;
  fVar17 = q2.z - fVar6;
  fVar18 = q1.z - fVar7;
  fVar12 = p2.x;
  fVar14 = q2.x - fVar12;
  fVar13 = p2.y;
  fVar16 = q2.y - fVar13;
  fVar19 = fVar17 * fVar17 + fVar14 * fVar14 + fVar16 * fVar16;
  fVar20 = fVar18 * fVar18 + fVar10 * fVar10 + fVar11 * fVar11;
  auVar3._4_4_ = -(uint)(fVar19 <= 1e-05);
  auVar3._0_4_ = -(uint)(fVar19 <= 1e-05);
  auVar3._8_4_ = -(uint)(fVar20 <= 1e-05);
  auVar3._12_4_ = -(uint)(fVar20 <= 1e-05);
  uVar4 = movmskpd(in_EAX,auVar3);
  bVar5 = (byte)uVar4;
  if ((bVar5 >> 1 & bVar5) == 1) {
    *t = 0.0;
    *s = 0.0;
    c1->x = (float)(int)p1._0_8_;
    c1->y = (float)(int)((ulong)p1._0_8_ >> 0x20);
    c1->z = fVar7;
    uVar15 = p2._0_8_;
    goto LAB_00132d86;
  }
  fVar22 = fVar17 * (fVar7 - fVar6) + fVar14 * (fVar8 - fVar12) + (fVar9 - fVar13) * fVar16;
  if (bVar5 >> 1 == 0) {
    fVar21 = (fVar7 - fVar6) * fVar18 + (fVar8 - fVar12) * fVar10 + (fVar9 - fVar13) * fVar11;
    if ((uVar4 & 1) == 0) {
      fVar23 = fVar18 * fVar17 + fVar10 * fVar14 + fVar11 * fVar16;
      fVar25 = fVar19 * fVar20 - fVar23 * fVar23;
      fVar24 = 0.0;
      if ((fVar25 != 0.0) || (NAN(fVar25))) {
        fVar24 = (fVar23 * fVar22 - fVar19 * fVar21) / fVar25;
      }
      *s = fVar24;
      fVar19 = (fVar24 * fVar23 + fVar22) / fVar19;
      *t = fVar19;
      if (0.0 <= fVar19) {
        if (1.0 < fVar19) {
          *t = 1.0;
          *s = (fVar23 - fVar21) / fVar20;
        }
        goto LAB_00132d4f;
      }
      *t = 0.0;
    }
    else {
      *t = 0.0;
    }
    *s = -fVar21 / fVar20;
  }
  else {
    *s = 0.0;
    fVar22 = fVar22 / fVar19;
    fVar19 = 1.0;
    if (fVar22 <= 1.0) {
      fVar19 = fVar22;
    }
    *t = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar19);
  }
LAB_00132d4f:
  fVar19 = *s;
  c1->x = fVar10 * fVar19 + fVar8;
  c1->y = fVar11 * fVar19 + fVar9;
  c1->z = fVar18 * fVar19 + fVar7;
  fVar8 = *t;
  uVar15 = CONCAT44(fVar16 * fVar8 + fVar13,fVar14 * fVar8 + fVar12);
  fVar6 = fVar6 + fVar17 * fVar8;
LAB_00132d86:
  c2->x = (float)(int)uVar15;
  c2->y = (float)(int)((ulong)uVar15 >> 0x20);
  c2->z = fVar6;
  uVar1 = c1->x;
  uVar2 = c1->y;
  fVar8 = (float)uVar1 - (float)uVar15;
  fVar9 = (float)uVar2 - (float)((ulong)uVar15 >> 0x20);
  fVar6 = c1->z - fVar6;
  return fVar6 * fVar6 + fVar8 * fVar8 + fVar9 * fVar9;
}

Assistant:

float closest_point_ray_segment(vec3 p1, vec3 q1, vec3 p2, vec3 q2, float *s, float *t, vec3 *c1, vec3 *c2) {
    vec3 d1 = vec3_sub(q1, p1);
    vec3 d2 = vec3_sub(q2, p2);
    vec3 r = vec3_sub(p1, p2);
    float a = vec3_dot(d1, d1);
    float e = vec3_dot(d2, d2);
    float f = vec3_dot(d2, r);

    if (a <= EPSILON && e <= EPSILON) {
        *s = *t = 0.0f;
        *c1 = p1;
        *c2 = p2;
        return vec3_dot(vec3_sub(*c1, *c2), vec3_sub(*c1, *c2)); 
    }
    if (a <= EPSILON) {
        *s = 0.0f;
        *t = f / e;
        *t = clamp(*t, 0.0f, 1.0f);
    } else {
        float c = vec3_dot(d1, r);
        if (e <= EPSILON) {
            *t = 0.0f;
            *s = -c / a;
        } else {
            float b = vec3_dot(d1, d2);
            float denom = a*e - b*b;

            if (denom != 0.0f) {
                *s = (b*f - c*e) / denom;
            } else {
                *s = 0.0f;
            }
            *t = (b*(*s) + f) / e;

            if (*t < 0.0f) {
                *t = 0.0f;
                *s = -c / a;
            } else if (*t > 1.0f) {
                *t = 1.0f;
                *s = (b - c) / a;
            }
        }
    }

    *c1 = vec3_add(p1, vec3_scale(d1, *s));
    *c2 = vec3_add(p2, vec3_scale(d2, *t));
    return vec3_dot(vec3_sub(*c1, *c2), vec3_sub(*c1, *c2));
}